

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::vertexAttribPointer
          (ReferenceContext *this,deUint32 index,int rawSize,deUint32 type,deBool normalized,
          int stride,void *pointer)

{
  DataBuffer *pDVar1;
  bool bVar2;
  byte bVar3;
  ContextType type_00;
  deBool dVar4;
  reference pvVar5;
  VertexArray *local_50;
  int local_44;
  VertexArray *vao;
  int effectiveSize;
  bool allowBGRA;
  int stride_local;
  deBool normalized_local;
  deUint32 type_local;
  int rawSize_local;
  deUint32 index_local;
  ReferenceContext *this_local;
  
  type_00 = Context::getType(&this->super_Context);
  bVar2 = glu::isContextTypeES(type_00);
  bVar3 = (bVar2 ^ 0xffU) & 1;
  local_44 = rawSize;
  if ((bVar3 != 0) && (rawSize == 0x80e1)) {
    local_44 = 4;
  }
  do {
    if ((uint)(this->m_limits).maxVertexAttribs <= index) {
      setError(this,0x501);
      return;
    }
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  while ((0 < local_44 && (local_44 < 5))) {
    dVar4 = ::deGetFalse();
    if (dVar4 == 0) {
      while ((((type == 0x1400 || (type == 0x1401)) || (type == 0x1402)) ||
             (((((type == 0x1403 || (type == 0x1404)) ||
                ((type == 0x1405 || ((type == 0x140c || (type == 0x140a)))))) || (type == 0x1406))
              || (((type == 0x140b || (type == 0x8d9f)) || (type == 0x8368))))))) {
        dVar4 = ::deGetFalse();
        if (dVar4 == 0) {
          while ((normalized == 1 || (normalized == 0))) {
            dVar4 = ::deGetFalse();
            if (dVar4 == 0) {
              do {
                if (stride < 0) {
                  setError(this,0x501);
                  return;
                }
                dVar4 = ::deGetFalse();
              } while (dVar4 != 0);
              while (((type != 0x8d9f && (type != 0x8368)) || (local_44 == 4))) {
                dVar4 = ::deGetFalse();
                if (dVar4 == 0) {
                  while (((this->m_vertexArrayBinding == (VertexArray *)0x0 ||
                          (this->m_arrayBufferBinding != (DataBuffer *)0x0)) ||
                         (pointer == (void *)0x0))) {
                    dVar4 = ::deGetFalse();
                    if (dVar4 == 0) {
                      while (((bVar3 == 0 || (rawSize != 0x80e1)) ||
                             ((type == 0x8d9f || ((type == 0x8368 || (type == 0x1401))))))) {
                        dVar4 = ::deGetFalse();
                        if (dVar4 == 0) {
                          while (((bVar3 == 0 || (rawSize != 0x80e1)) || (normalized != 0))) {
                            dVar4 = ::deGetFalse();
                            if (dVar4 == 0) {
                              if (this->m_vertexArrayBinding == (VertexArray *)0x0) {
                                local_50 = &this->m_clientVertexArray;
                              }
                              else {
                                local_50 = this->m_vertexArrayBinding;
                              }
                              pvVar5 = std::
                                       vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                                       ::operator[](&local_50->m_arrays,(ulong)index);
                              pvVar5->size = rawSize;
                              pvVar5 = std::
                                       vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                                       ::operator[](&local_50->m_arrays,(ulong)index);
                              pvVar5->stride = stride;
                              pvVar5 = std::
                                       vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                                       ::operator[](&local_50->m_arrays,(ulong)index);
                              pvVar5->type = type;
                              pvVar5 = std::
                                       vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                                       ::operator[](&local_50->m_arrays,(ulong)index);
                              pvVar5->normalized = normalized == 1;
                              pvVar5 = std::
                                       vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                                       ::operator[](&local_50->m_arrays,(ulong)index);
                              pvVar5->integer = false;
                              pvVar5 = std::
                                       vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                                       ::operator[](&local_50->m_arrays,(ulong)index);
                              pvVar5->pointer = pointer;
                              if (this->m_arrayBufferBinding != (DataBuffer *)0x0) {
                                rc::ObjectManager<sglr::rc::DataBuffer>::acquireReference
                                          (&this->m_buffers,this->m_arrayBufferBinding);
                              }
                              pvVar5 = std::
                                       vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                                       ::operator[](&local_50->m_arrays,(ulong)index);
                              if (pvVar5->bufferBinding != (DataBuffer *)0x0) {
                                pvVar5 = std::
                                         vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                                         ::operator[](&local_50->m_arrays,(ulong)index);
                                rc::ObjectManager<sglr::rc::DataBuffer>::releaseReference
                                          (&this->m_buffers,pvVar5->bufferBinding);
                              }
                              pvVar5 = std::
                                       vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                                       ::operator[](&local_50->m_arrays,(ulong)index);
                              pvVar5->bufferDeleted = false;
                              pDVar1 = this->m_arrayBufferBinding;
                              pvVar5 = std::
                                       vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                                       ::operator[](&local_50->m_arrays,(ulong)index);
                              pvVar5->bufferBinding = pDVar1;
                              return;
                            }
                          }
                          setError(this,0x502);
                          return;
                        }
                      }
                      setError(this,0x502);
                      return;
                    }
                  }
                  setError(this,0x502);
                  return;
                }
              }
              setError(this,0x502);
              return;
            }
          }
          setError(this,0x500);
          return;
        }
      }
      setError(this,0x500);
      return;
    }
  }
  setError(this,0x501);
  return;
}

Assistant:

void ReferenceContext::vertexAttribPointer (deUint32 index, int rawSize, deUint32 type, deBool normalized, int stride, const void *pointer)
{
	const bool allowBGRA	= !glu::isContextTypeES(getType());
	const int effectiveSize	= (allowBGRA && rawSize == GL_BGRA) ? (4) : (rawSize);

	RC_IF_ERROR(index >= (deUint32)m_limits.maxVertexAttribs, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(effectiveSize <= 0 || effectiveSize > 4, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(type != GL_BYTE					&&	type != GL_UNSIGNED_BYTE	&&
				type != GL_SHORT				&&	type != GL_UNSIGNED_SHORT	&&
				type != GL_INT					&&	type != GL_UNSIGNED_INT		&&
				type != GL_FIXED				&&	type != GL_DOUBLE			&&
				type != GL_FLOAT				&&	type != GL_HALF_FLOAT		&&
				type != GL_INT_2_10_10_10_REV	&&	type != GL_UNSIGNED_INT_2_10_10_10_REV, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(normalized != GL_TRUE && normalized != GL_FALSE, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(stride < 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR((type == GL_INT_2_10_10_10_REV || type == GL_UNSIGNED_INT_2_10_10_10_REV) && effectiveSize != 4, GL_INVALID_OPERATION, RC_RET_VOID);
	RC_IF_ERROR(m_vertexArrayBinding != DE_NULL && m_arrayBufferBinding == DE_NULL && pointer != DE_NULL, GL_INVALID_OPERATION, RC_RET_VOID);
	RC_IF_ERROR(allowBGRA && rawSize == GL_BGRA && type != GL_INT_2_10_10_10_REV && type != GL_UNSIGNED_INT_2_10_10_10_REV && type != GL_UNSIGNED_BYTE, GL_INVALID_OPERATION, RC_RET_VOID);
	RC_IF_ERROR(allowBGRA && rawSize == GL_BGRA && normalized == GL_FALSE, GL_INVALID_OPERATION, RC_RET_VOID);

	rc::VertexArray& vao = (m_vertexArrayBinding) ? (*m_vertexArrayBinding) : (m_clientVertexArray);

	vao.m_arrays[index].size			= rawSize;
	vao.m_arrays[index].stride			= stride;
	vao.m_arrays[index].type			= type;
	vao.m_arrays[index].normalized		= normalized == GL_TRUE;
	vao.m_arrays[index].integer			= false;
	vao.m_arrays[index].pointer			= pointer;

	// acquire new reference
	if (m_arrayBufferBinding)
		m_buffers.acquireReference(m_arrayBufferBinding);

	// release old reference
	if (vao.m_arrays[index].bufferBinding)
		m_buffers.releaseReference(vao.m_arrays[index].bufferBinding);

	vao.m_arrays[index].bufferDeleted	= false;
	vao.m_arrays[index].bufferBinding	= m_arrayBufferBinding;
}